

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestAssert.h
# Opt level: O0

void CppUnit::assertEquals<double>
               (double *expected,double *actual,SourceLine *sourceLine,string *message)

{
  bool bVar1;
  allocator<char> local_111;
  string local_110 [32];
  AdditionalMessage local_f0 [136];
  string local_68;
  string local_48;
  string *local_28;
  string *message_local;
  SourceLine *sourceLine_local;
  double *actual_local;
  double *expected_local;
  
  local_28 = message;
  message_local = (string *)sourceLine;
  sourceLine_local = (SourceLine *)actual;
  actual_local = expected;
  bVar1 = assertion_traits<double>::equal(*expected,*actual);
  if (!bVar1) {
    assertion_traits<double>::toString_abi_cxx11_
              (&local_48,(assertion_traits<double> *)actual,*actual_local);
    assertion_traits<double>::toString_abi_cxx11_
              (&local_68,(assertion_traits<double> *)actual,*(double *)sourceLine_local);
    CppUnit::AdditionalMessage::AdditionalMessage(local_f0,(string *)local_28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_110,"equality assertion failed",&local_111);
    CppUnit::Asserter::failNotEqual(&local_48,&local_68,sourceLine,local_f0,local_110);
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator(&local_111);
    AdditionalMessage::~AdditionalMessage(local_f0);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void assertEquals( const T& expected,
                   const T& actual,
                   SourceLine sourceLine,
                   const std::string &message )
{
  if ( !assertion_traits<T>::equal(expected,actual) ) // lazy toString conversion...
  {
    Asserter::failNotEqual( assertion_traits<T>::toString(expected),
                            assertion_traits<T>::toString(actual),
                            sourceLine,
                            message );
  }
}